

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O0

int Fra_ClausInductiveClauses(Clu_Man_t *p)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  lit lVar5;
  sat_solver *psVar6;
  int *piVar7;
  int local_40;
  int fFlag;
  int f;
  int k;
  int i;
  int Counter;
  int End;
  int Beg;
  int RetValue;
  int nLitsTot;
  int *pStart;
  Clu_Man_t *p_local;
  
  p->fFail = 0;
  if (p->pSatMain != (sat_solver *)0x0) {
    sat_solver_delete(p->pSatMain);
  }
  psVar6 = (sat_solver *)Cnf_DataWriteIntoSolver(p->pCnf,p->nFrames + 1,0);
  p->pSatMain = psVar6;
  if (p->pSatMain == (sat_solver *)0x0) {
    printf("Error: Main solver is unsat.\n");
    p_local._4_4_ = -1;
  }
  else {
    Fra_ClausSimInfoClean(p);
    iVar2 = p->pCnf->nVars * 2;
    piVar7 = Vec_IntArray(p->vLitsProven);
    for (local_40 = 0; local_40 < p->nFrames; local_40 = local_40 + 1) {
      Counter = 0;
      for (f = 0; iVar3 = Vec_IntSize(p->vClausesProven), f < iVar3; f = f + 1) {
        iVar3 = Vec_IntEntry(p->vClausesProven,f);
        if (p->nLutSize < iVar3 - Counter) {
          __assert_fail("End - Beg <= p->nLutSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/fra/fraClaus.c"
                        ,0x47c,"int Fra_ClausInductiveClauses(Clu_Man_t *)");
        }
        iVar4 = sat_solver_addclause(p->pSatMain,piVar7 + Counter,piVar7 + iVar3);
        if (iVar4 == 0) {
          printf("Error: Solver is UNSAT after adding assumption clauses.\n");
          return -1;
        }
        Counter = iVar3;
      }
      for (f = 0; iVar3 = Vec_IntSize(p->vLitsProven), f < iVar3; f = f + 1) {
        piVar1 = p->vLitsProven->pArray;
        piVar1[f] = iVar2 + piVar1[f];
      }
    }
    iVar3 = p->nFrames;
    for (f = 0; iVar4 = Vec_IntSize(p->vLitsProven), f < iVar4; f = f + 1) {
      piVar7 = p->vLitsProven->pArray;
      piVar7[f] = piVar7[f] - iVar3 * iVar2;
    }
    iVar2 = p->pCnf->nVars * 2;
    piVar7 = Vec_IntArray(p->vLits);
    for (local_40 = 0; local_40 < p->nFrames; local_40 = local_40 + 1) {
      Counter = 0;
      for (f = 0; iVar3 = Vec_IntSize(p->vClauses), f < iVar3; f = f + 1) {
        iVar3 = Vec_IntEntry(p->vClauses,f);
        iVar4 = Vec_IntEntry(p->vCosts,f);
        if (iVar4 != -1) {
          iVar4 = Vec_IntEntry(p->vCosts,f);
          if (iVar4 < 1) {
            __assert_fail("Vec_IntEntry( p->vCosts, i ) > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/fra/fraClaus.c"
                          ,0x4af,"int Fra_ClausInductiveClauses(Clu_Man_t *)");
          }
          if (p->nLutSize < iVar3 - Counter) {
            __assert_fail("End - Beg <= p->nLutSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/fra/fraClaus.c"
                          ,0x4b0,"int Fra_ClausInductiveClauses(Clu_Man_t *)");
          }
          iVar4 = sat_solver_addclause(p->pSatMain,piVar7 + Counter,piVar7 + iVar3);
          if (iVar4 == 0) {
            printf("Error: Solver is UNSAT after adding assumption clauses.\n");
            return -1;
          }
        }
        Counter = iVar3;
      }
      for (f = 0; iVar3 = Vec_IntSize(p->vLits), f < iVar3; f = f + 1) {
        piVar1 = p->vLits->pArray;
        piVar1[f] = iVar2 + piVar1[f];
      }
    }
    if (p->pSatMain->qtail != p->pSatMain->qhead) {
      iVar3 = sat_solver_simplify(p->pSatMain);
      if (iVar3 == 0) {
        __assert_fail("RetValue != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/fra/fraClaus.c"
                      ,0x4c3,"int Fra_ClausInductiveClauses(Clu_Man_t *)");
      }
      if (p->pSatMain->qtail != p->pSatMain->qhead) {
        __assert_fail("p->pSatMain->qtail == p->pSatMain->qhead",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/fra/fraClaus.c"
                      ,0x4c4,"int Fra_ClausInductiveClauses(Clu_Man_t *)");
      }
    }
    if (p->fTarget != 0) {
      iVar3 = Fra_ClausRunSat0(p);
      if (iVar3 == 0) {
        if (p->fVerbose != 0) {
          printf(" Property fails.  ");
        }
        p->fFail = 1;
      }
      else if (p->fVerbose != 0) {
        printf(" Property holds.  ");
      }
    }
    if (p->pSatMain->qtail != p->pSatMain->qhead) {
      iVar3 = sat_solver_simplify(p->pSatMain);
      if (iVar3 == 0) {
        __assert_fail("RetValue != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/fra/fraClaus.c"
                      ,0x4f0,"int Fra_ClausInductiveClauses(Clu_Man_t *)");
      }
      if (p->pSatMain->qtail != p->pSatMain->qhead) {
        __assert_fail("p->pSatMain->qtail == p->pSatMain->qhead",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/fra/fraClaus.c"
                      ,0x4f1,"int Fra_ClausInductiveClauses(Clu_Man_t *)");
      }
    }
    Counter = 0;
    k = 0;
    for (f = 0; iVar3 = Vec_IntSize(p->vClauses), f < iVar3; f = f + 1) {
      iVar3 = Vec_IntEntry(p->vClauses,f);
      iVar4 = Vec_IntEntry(p->vCosts,f);
      if (iVar4 != -1) {
        iVar4 = Vec_IntEntry(p->vCosts,f);
        if (iVar4 < 1) {
          __assert_fail("Vec_IntEntry( p->vCosts, i ) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/fra/fraClaus.c"
                        ,0x4ff,"int Fra_ClausInductiveClauses(Clu_Man_t *)");
        }
        if (p->nLutSize < iVar3 - Counter) {
          __assert_fail("End - Beg <= p->nLutSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/fra/fraClaus.c"
                        ,0x500,"int Fra_ClausInductiveClauses(Clu_Man_t *)");
        }
        iVar4 = Fra_ClausSimInfoCheck(p,piVar7 + Counter,iVar3 - Counter);
        if (iVar4 == 0) {
          for (fFlag = Counter; fFlag < iVar3; fFlag = fFlag + 1) {
            lVar5 = lit_neg(piVar7[fFlag]);
            piVar7[fFlag] = lVar5;
          }
          iVar4 = sat_solver_solve(p->pSatMain,piVar7 + Counter,piVar7 + iVar3,(long)p->nBTLimit,0,0
                                   ,0);
          for (fFlag = Counter; fFlag < iVar3; fFlag = fFlag + 1) {
            lVar5 = lit_neg(piVar7[fFlag]);
            piVar7[fFlag] = lVar5;
          }
          if (iVar4 == -1) {
            if (p->pSatMain->qtail != p->pSatMain->qhead) {
              iVar4 = sat_solver_simplify(p->pSatMain);
              if (iVar4 == 0) {
                __assert_fail("RetValue != 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/fra/fraClaus.c"
                              ,0x539,"int Fra_ClausInductiveClauses(Clu_Man_t *)");
              }
              if (p->pSatMain->qtail != p->pSatMain->qhead) {
                __assert_fail("p->pSatMain->qtail == p->pSatMain->qhead",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/fra/fraClaus.c"
                              ,0x53a,"int Fra_ClausInductiveClauses(Clu_Man_t *)");
              }
            }
          }
          else {
            Fra_ClausSimInfoRecord(p,p->pSatMain->model + p->nFrames * p->pCnf->nVars);
            Vec_IntWriteEntry(p->vCosts,f,-1);
            k = k + 1;
          }
        }
        else {
          Vec_IntWriteEntry(p->vCosts,f,-1);
          k = k + 1;
        }
      }
      Counter = iVar3;
    }
    iVar3 = p->nFrames;
    for (f = 0; iVar4 = Vec_IntSize(p->vLits), f < iVar4; f = f + 1) {
      piVar7 = p->vLits->pArray;
      piVar7[f] = piVar7[f] - iVar3 * iVar2;
    }
    p_local._4_4_ = k;
  }
  return p_local._4_4_;
}

Assistant:

int Fra_ClausInductiveClauses( Clu_Man_t * p )
{
//    Aig_Obj_t * pObjLi, * pObjLo;
    int * pStart, nLitsTot, RetValue, Beg, End, Counter, i, k, f, fFlag;//, Lits[2];
    p->fFail = 0;

    // reset the solver
    if ( p->pSatMain )  sat_solver_delete( p->pSatMain );
    p->pSatMain = (sat_solver *)Cnf_DataWriteIntoSolver( p->pCnf, p->nFrames+1, 0 );
    if ( p->pSatMain == NULL )
    {
        printf( "Error: Main solver is unsat.\n" );
        return -1;
    }  
    Fra_ClausSimInfoClean( p );

/*
    // check if the property holds
    if ( Fra_ClausRunSat0( p ) )
        printf( "Property holds without strengthening.\n" );
    else
        printf( "Property does not hold without strengthening.\n" );
*/
/*
    // add constant registers
    Aig_ManForEachLiLoSeq( p->pAig, pObjLi, pObjLo, i )  
        if ( Aig_ObjFanin0(pObjLi) == Aig_ManConst1(p->pAig) )
        {
            for ( k = 0; k < p->nFrames; k++ )
            {
                Lits[0] = k * 2 * p->pCnf->nVars + toLitCond( p->pCnf->pVarNums[pObjLo->Id], Aig_ObjFaninC0(pObjLi) ); 
                RetValue = sat_solver_addclause( p->pSatMain, Lits, Lits + 1 );
                if ( RetValue == 0 )
                {
                    printf( "Error: Solver is UNSAT after adding constant-register clauses.\n" );
                    return -1;
                }
            }
        }
*/


    // add the proven clauses
    nLitsTot = 2 * p->pCnf->nVars;
    pStart = Vec_IntArray(p->vLitsProven);
    for ( f = 0; f < p->nFrames; f++ )
    {
        Beg = 0;
        Vec_IntForEachEntry( p->vClausesProven, End, i )
        {
            assert( End - Beg <= p->nLutSize );
            // add the clause to all timeframes
            RetValue = sat_solver_addclause( p->pSatMain, pStart + Beg, pStart + End );
            if ( RetValue == 0 )
            {
                printf( "Error: Solver is UNSAT after adding assumption clauses.\n" );
                return -1;
            }
            Beg = End;
        }
        // increment literals
        for ( i = 0; i < Vec_IntSize(p->vLitsProven); i++ )
            p->vLitsProven->pArray[i] += nLitsTot;
    }
    // return clauses back to normal
    nLitsTot = (p->nFrames) * nLitsTot;
    for ( i = 0; i < Vec_IntSize(p->vLitsProven); i++ )
        p->vLitsProven->pArray[i] -= nLitsTot;

/*
    // add the proven clauses
    nLitsTot = 2 * p->pCnf->nVars;
    pStart = Vec_IntArray(p->vLitsProven);
    Beg = 0;
    Vec_IntForEachEntry( p->vClausesProven, End, i )
    {
        assert( End - Beg <= p->nLutSize );
        // add the clause to all timeframes
        RetValue = sat_solver_addclause( p->pSatMain, pStart + Beg, pStart + End );
        if ( RetValue == 0 )
        {
            printf( "Error: Solver is UNSAT after adding assumption clauses.\n" );
            return -1;
        }
        Beg = End;
    }
*/
    
    // add the clauses
    nLitsTot = 2 * p->pCnf->nVars;
    pStart = Vec_IntArray(p->vLits);
    for ( f = 0; f < p->nFrames; f++ )
    {
        Beg = 0;
        Vec_IntForEachEntry( p->vClauses, End, i )
        {
            if ( Vec_IntEntry( p->vCosts, i ) == -1 )
            {
                Beg = End;
                continue;
            }
            assert( Vec_IntEntry( p->vCosts, i ) > 0 );
            assert( End - Beg <= p->nLutSize );
            // add the clause to all timeframes
            RetValue = sat_solver_addclause( p->pSatMain, pStart + Beg, pStart + End );
            if ( RetValue == 0 )
            {
                printf( "Error: Solver is UNSAT after adding assumption clauses.\n" );
                return -1;
            }
            Beg = End;
        }
        // increment literals
        for ( i = 0; i < Vec_IntSize(p->vLits); i++ )
            p->vLits->pArray[i] += nLitsTot;
    }

    // simplify the solver
    if ( p->pSatMain->qtail != p->pSatMain->qhead )
    {
        RetValue = sat_solver_simplify(p->pSatMain);
        assert( RetValue != 0 );
        assert( p->pSatMain->qtail == p->pSatMain->qhead );
    }
  
    // check if the property holds
    if ( p->fTarget )
    {
        if ( Fra_ClausRunSat0( p ) )
        {
            if ( p->fVerbose )
            printf( " Property holds.  " );
        }
        else
        {
            if ( p->fVerbose )
            printf( " Property fails.  " );
    //        return -2;
            p->fFail = 1;
        }
    }

/*
    // add the property for the first K frames
    for ( i = 0; i < p->nFrames; i++ )
    {
        Aig_Obj_t * pObj;
        int Lits[2];
        // set the output literals
        pObj = Aig_ManCo(p->pAig, 0);
        Lits[0] = i * nLitsTot + toLitCond( p->pCnf->pVarNums[pObj->Id], 1 ); 
        // add the clause
        RetValue = sat_solver_addclause( p->pSatMain, Lits, Lits + 1 );
//        assert( RetValue == 1 );
        if ( RetValue == 0 )
        {
            printf( "Error: Solver is UNSAT after adding property for the first K frames.\n" );
            return -1;
        }
    }
*/

    // simplify the solver
    if ( p->pSatMain->qtail != p->pSatMain->qhead )
    {
        RetValue = sat_solver_simplify(p->pSatMain);
        assert( RetValue != 0 );
        assert( p->pSatMain->qtail == p->pSatMain->qhead );
    }


    // check the clause in the last timeframe
    Beg = 0;
    Counter = 0;
    Vec_IntForEachEntry( p->vClauses, End, i )
    {
        if ( Vec_IntEntry( p->vCosts, i ) == -1 )
        {
            Beg = End;
            continue;
        }
        assert( Vec_IntEntry( p->vCosts, i ) > 0 );
        assert( End - Beg <= p->nLutSize );

        if ( Fra_ClausSimInfoCheck(p, pStart + Beg, End - Beg) )
        {
            fFlag = 1;
//            printf( "s-" );

            Beg = End;
            Vec_IntWriteEntry( p->vCosts, i, -1 );
            Counter++;
            continue;
        }
        else
        {
            fFlag = 0;
//            printf( "s?" );
        }

        for ( k = Beg; k < End; k++ )
            pStart[k] = lit_neg( pStart[k] );
        RetValue = sat_solver_solve( p->pSatMain, pStart + Beg, pStart + End, (ABC_INT64_T)p->nBTLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
        for ( k = Beg; k < End; k++ )
            pStart[k] = lit_neg( pStart[k] );

        // the problem is not solved
        if ( RetValue != l_False )
        {
//            printf( "S- " );
//            Fra_ClausSimInfoRecord( p, (int*)p->pSatMain->model.ptr + p->nFrames * p->pCnf->nVars );
            Fra_ClausSimInfoRecord( p, (int*)p->pSatMain->model + p->nFrames * p->pCnf->nVars );
//            RetValue = Fra_ClausSimInfoCheck(p, pStart + Beg, End - Beg);
//            assert( RetValue );

            Beg = End;
            Vec_IntWriteEntry( p->vCosts, i, -1 );
            Counter++;
            continue;
        }
//        printf( "S+ " );
//        assert( !fFlag );

/*
        // add the clause
        RetValue = sat_solver_addclause( p->pSatMain, pStart + Beg, pStart + End );
//        assert( RetValue == 1 );
        if ( RetValue == 0 )
        {
            printf( "Error: Solver is UNSAT after adding proved clauses.\n" );
            return -1;
        }
*/
        Beg = End;

        // simplify the solver
        if ( p->pSatMain->qtail != p->pSatMain->qhead )
        {
            RetValue = sat_solver_simplify(p->pSatMain);
            assert( RetValue != 0 );
            assert( p->pSatMain->qtail == p->pSatMain->qhead );
        }
    }

    // return clauses back to normal
    nLitsTot = p->nFrames * nLitsTot;
    for ( i = 0; i < Vec_IntSize(p->vLits); i++ )
        p->vLits->pArray[i] -= nLitsTot;

//    if ( fFail )
//        return -2;
    return Counter;
}